

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall test_ethash_dir_creation::test_method(test_ethash_dir_creation *this)

{
  ethash_h256_t seedhash_00;
  bool bVar1;
  lazy_ostream *plVar2;
  undefined8 uVar3;
  undefined8 in_stack_fffffffffffffdb8;
  uint64_t in_stack_fffffffffffffdc0;
  basic_cstring<const_char> *pbVar4;
  FILE **in_stack_fffffffffffffdc8;
  basic_cstring<const_char> *pbVar5;
  char *in_stack_fffffffffffffdd0;
  char *s;
  path local_1f8;
  basic_cstring<const_char> local_1d8;
  basic_cstring<const_char> local_1c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1b8;
  path local_198;
  assertion_result local_178;
  basic_cstring<const_char> local_160;
  basic_cstring<const_char> local_150;
  basic_cstring<const_char> local_140;
  basic_cstring<const_char> local_130;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_120;
  assertion_result local_100;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  FILE *local_c8;
  uint8_t auStack_c0 [8];
  uint8_t local_b8 [8];
  uint8_t auStack_b0 [12];
  ethash_io_rc local_a4 [5];
  basic_cstring<const_char> local_90;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_80;
  basic_cstring<const_char> local_58;
  basic_cstring<const_char> local_48;
  FILE *local_38;
  FILE *f;
  ethash_h256_t seedhash;
  test_ethash_dir_creation *this_local;
  
  local_38 = (FILE *)0x0;
  seedhash.b._24_8_ = this;
  memset(&f,0,0x20);
  do {
    s = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
    pbVar4 = &local_48;
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (pbVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    pbVar5 = &local_58;
    boost::unit_test::basic_cstring<const_char>::basic_cstring(pbVar5);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,pbVar4,0xdd,pbVar5);
    plVar2 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_80,plVar2,(char (*) [1])0x15b3a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_90,s,0x53);
    local_a4[1] = 2;
    local_b8[0] = seedhash.b[8];
    local_b8[1] = seedhash.b[9];
    local_b8[2] = seedhash.b[10];
    local_b8[3] = seedhash.b[0xb];
    local_b8[4] = seedhash.b[0xc];
    local_b8[5] = seedhash.b[0xd];
    local_b8[6] = seedhash.b[0xe];
    local_b8[7] = seedhash.b[0xf];
    auStack_b0[0] = seedhash.b[0x10];
    auStack_b0[1] = seedhash.b[0x11];
    auStack_b0[2] = seedhash.b[0x12];
    auStack_b0[3] = seedhash.b[0x13];
    auStack_b0[4] = seedhash.b[0x14];
    auStack_b0[5] = seedhash.b[0x15];
    auStack_b0[6] = seedhash.b[0x16];
    auStack_b0[7] = seedhash.b[0x17];
    local_c8 = f;
    auStack_c0[0] = seedhash.b[0];
    auStack_c0[1] = seedhash.b[1];
    auStack_c0[2] = seedhash.b[2];
    auStack_c0[3] = seedhash.b[3];
    auStack_c0[4] = seedhash.b[4];
    auStack_c0[5] = seedhash.b[5];
    auStack_c0[6] = seedhash.b[6];
    auStack_c0[7] = seedhash.b[7];
    seedhash_00.b._8_8_ = pbVar4;
    seedhash_00.b[0] = (char)uVar3;
    seedhash_00.b[1] = (char)((ulong)uVar3 >> 8);
    seedhash_00.b[2] = (char)((ulong)uVar3 >> 0x10);
    seedhash_00.b[3] = (char)((ulong)uVar3 >> 0x18);
    seedhash_00.b[4] = (char)((ulong)uVar3 >> 0x20);
    seedhash_00.b[5] = (char)((ulong)uVar3 >> 0x28);
    seedhash_00.b[6] = (char)((ulong)uVar3 >> 0x30);
    seedhash_00.b[7] = (char)((ulong)uVar3 >> 0x38);
    seedhash_00.b._16_8_ = pbVar5;
    seedhash_00.b._24_8_ = s;
    uVar3 = seedhash.b._16_8_;
    local_a4[0] = ethash_io_prepare(in_stack_fffffffffffffdd0,seedhash_00,in_stack_fffffffffffffdc8,
                                    in_stack_fffffffffffffdc0,
                                    SUB81((ulong)in_stack_fffffffffffffdb8 >> 0x38,0));
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ethash_io_rc,ethash_io_rc>
              (&local_80,&local_90,0xdd,2,2,local_a4 + 1,"ETHASH_IO_MEMO_MISMATCH",local_a4,
               "ethash_io_prepare(\"./test_ethash_directory/\", seedhash, &f, 64, false)",uVar3);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_80);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    pbVar4 = &local_d8;
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (pbVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    pbVar5 = &local_e8;
    boost::unit_test::basic_cstring<const_char>::basic_cstring(pbVar5);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,pbVar4,0xde,pbVar5);
    boost::test_tools::assertion_result::assertion_result<_IO_FILE*>
              (&local_100,(_IO_FILE **)&local_38);
    plVar2 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_130,"f",1);
    boost::unit_test::operator<<(&local_120,plVar2,&local_130);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_140,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::test_tools::tt_detail::report_assertion(&local_100,&local_120,&local_140,0xde,2,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_120);
    boost::test_tools::assertion_result::~assertion_result(&local_100);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_150,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_160);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,&local_150,0xe1,&local_160);
    boost::filesystem::path::path(&local_198,"./test_ethash_directory/");
    bVar1 = boost::filesystem::is_directory(&local_198);
    boost::test_tools::assertion_result::assertion_result(&local_178,bVar1);
    plVar2 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c8,"fs::is_directory(fs::path(\"./test_ethash_directory/\"))",0x36);
    boost::unit_test::operator<<(&local_1b8,plVar2,&local_1c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::test_tools::tt_detail::report_assertion(&local_178,&local_1b8,&local_1d8,0xe1,2,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1b8);
    boost::test_tools::assertion_result::~assertion_result(&local_178);
    boost::filesystem::path::~path(&local_198);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  fclose(local_38);
  boost::filesystem::path::path(&local_1f8,"./test_ethash_directory/");
  boost::filesystem::remove_all(&local_1f8);
  boost::filesystem::path::~path(&local_1f8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ethash_dir_creation) {
	ethash_h256_t seedhash;
	FILE *f = NULL;
	memset(&seedhash, 0, 32);
	BOOST_REQUIRE_EQUAL(
		ETHASH_IO_MEMO_MISMATCH,
		ethash_io_prepare("./test_ethash_directory/", seedhash, &f, 64, false)
	);
	BOOST_REQUIRE(f);

	// let's make sure that the directory was created
	BOOST_REQUIRE(fs::is_directory(fs::path("./test_ethash_directory/")));

	// cleanup
	fclose(f);
	fs::remove_all("./test_ethash_directory/");
}